

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IsinfCase::getInputValues(IsinfCase *this,int numValues,void **values)

{
  bool bVar1;
  deUint32 dVar2;
  DataType dataType;
  Precision precision_00;
  int iVar3;
  int numAccurateBits;
  deUint32 dVar4;
  char *str;
  const_reference pvVar5;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float fVar6;
  float fVar7;
  uint local_a4;
  uint local_9c;
  deUint32 value;
  deUint32 sign;
  deUint32 exp;
  deUint32 mantissa;
  bool isNan;
  bool isInf;
  int valNdx;
  deUint32 mantissaMask;
  int mantissaBits;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  IsinfCase *this_local;
  
  rnd.m_rnd._8_8_ = values;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0xc2a39f);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar5->varType);
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  precision_00 = glu::VarType::getPrecision(&pvVar5->varType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  numAccurateBits = getMinMantissaBits(precision_00);
  dVar2 = getMaxUlpDiffFromBits(numAccurateBits);
  for (mantissa = 0; (int)mantissa < numValues * iVar3; mantissa = mantissa + 1) {
    fVar6 = de::Random::getFloat((Random *)&precision);
    bVar1 = false;
    if (0.3 < fVar6) {
      local_9c = 0;
    }
    else {
      fVar7 = de::Random::getFloat((Random *)&precision);
      bVar1 = 0.4 < fVar7;
      dVar4 = de::Random::getUint32((Random *)&precision);
      local_9c = dVar4 & (dVar2 ^ 0xffffffff) & 0x7fffff | 0x400000;
    }
    if ((bVar1) || (0.3 < fVar6)) {
      local_a4 = 0xff;
    }
    else {
      dVar4 = de::Random::getUint32((Random *)&precision);
      local_a4 = dVar4 & 0x7f;
    }
    dVar4 = de::Random::getUint32((Random *)&precision);
    *(deUint32 *)(*(long *)rnd.m_rnd._8_8_ + (long)(int)mantissa * 4) =
         dVar4 << 0x1f | local_a4 << 0x17 | local_9c;
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(getName()) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isInf		= rnd.getFloat() > 0.3f;
			const bool		isNan		= !isInf && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}